

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O0

MppDevBufMapNode * mpp_buffer_attach_dev_lock(char *caller,MppBuffer buffer,MppDev dev)

{
  MPP_RET MVar1;
  MppDevBufMapNode *pMStack_40;
  MPP_RET ret;
  MppDevBufMapNode *node;
  MppDevBufMapNode *n;
  MppDevBufMapNode *pos;
  MppBufferImpl *impl;
  MppDev dev_local;
  MppBuffer buffer_local;
  char *caller_local;
  
  mpp_dev_ioctl(dev,0xb,(void *)0x0);
  pthread_mutex_lock((pthread_mutex_t *)((long)buffer + 0x28));
  n = *(MppDevBufMapNode **)((long)buffer + 0xd8);
  node = (MppDevBufMapNode *)(n->list_buf).next;
  do {
    if (n == (MppDevBufMapNode *)((long)buffer + 0xd8)) {
      pMStack_40 = (MppDevBufMapNode *)mpp_mem_pool_get_f(caller,mpp_buf_map_node_pool);
      if (pMStack_40 == (MppDevBufMapNode *)0x0) {
        _mpp_log_l(2,"mpp_buffer","mpp_buffer_attach_dev failed to allocate map node\n",(char *)0x0)
        ;
      }
      else {
        (pMStack_40->list_buf).next = (list_head *)pMStack_40;
        (pMStack_40->list_buf).prev = (list_head *)pMStack_40;
        (pMStack_40->list_dev).next = &pMStack_40->list_dev;
        (pMStack_40->list_dev).prev = &pMStack_40->list_dev;
        pMStack_40->lock_buf = (pthread_mutex_t *)((long)buffer + 0x28);
        pMStack_40->buffer = buffer;
        pMStack_40->dev = dev;
        pMStack_40->pool = mpp_buf_map_node_pool;
        pMStack_40->buf_fd = *(RK_S32 *)((long)buffer + 0xa0);
        MVar1 = mpp_dev_ioctl(dev,0xd,pMStack_40);
        if (MVar1 == MPP_OK) {
          list_add_tail((list_head *)pMStack_40,(list_head *)((long)buffer + 0xd8));
        }
        else {
          mpp_mem_pool_put_f(caller,mpp_buf_map_node_pool,pMStack_40);
          pMStack_40 = (MppDevBufMapNode *)0x0;
        }
      }
LAB_0016d94f:
      pthread_mutex_unlock((pthread_mutex_t *)((long)buffer + 0x28));
      mpp_dev_ioctl(dev,0xc,(void *)0x0);
      return pMStack_40;
    }
    if (n->dev == dev) {
      pMStack_40 = n;
      goto LAB_0016d94f;
    }
    n = node;
    node = (MppDevBufMapNode *)(node->list_buf).next;
  } while( true );
}

Assistant:

static MppDevBufMapNode *mpp_buffer_attach_dev_lock(const char *caller, MppBuffer buffer, MppDev dev)
{
    MppBufferImpl *impl = (MppBufferImpl *)buffer;
    MppDevBufMapNode *pos, *n;
    MppDevBufMapNode *node = NULL;
    MPP_RET ret = MPP_OK;

    mpp_dev_ioctl(dev, MPP_DEV_LOCK_MAP, NULL);
    pthread_mutex_lock(&impl->lock);

    list_for_each_entry_safe(pos, n, &impl->list_maps, MppDevBufMapNode, list_buf) {
        if (pos->dev == dev) {
            node = pos;
            goto DONE;
        }
    }

    node = (MppDevBufMapNode *)mpp_mem_pool_get_f(caller, mpp_buf_map_node_pool);
    if (!node) {
        mpp_err("mpp_buffer_attach_dev failed to allocate map node\n");
        ret = MPP_NOK;
        goto DONE;
    }

    INIT_LIST_HEAD(&node->list_buf);
    INIT_LIST_HEAD(&node->list_dev);
    node->lock_buf = &impl->lock;
    node->buffer = impl;
    node->dev = dev;
    node->pool = mpp_buf_map_node_pool;
    node->buf_fd = impl->info.fd;

    ret = mpp_dev_ioctl(dev, MPP_DEV_ATTACH_FD, node);
    if (ret) {
        mpp_mem_pool_put_f(caller, mpp_buf_map_node_pool, node);
        node = NULL;
        goto DONE;
    }
    list_add_tail(&node->list_buf, &impl->list_maps);

DONE:
    pthread_mutex_unlock(&impl->lock);
    mpp_dev_ioctl(dev, MPP_DEV_UNLOCK_MAP, NULL);

    return node;
}